

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Ptr_t * Llb_Nonlin4DerivePartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  void *pvVar1;
  uint uVar2;
  DdNode *pDVar3;
  Vec_Ptr_t *__ptr;
  void **ppvVar4;
  DdNode *n;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong local_38;
  
  Aig_ManCleanData(pAig);
  pDVar3 = Cudd_ReadOne(dd);
  (pAig->pConst1->field_5).pData = pDVar3;
  pVVar5 = pAig->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      iVar10 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar10 < 0) || (vOrder->nSize <= iVar10)) goto LAB_007e5d34;
      pDVar3 = Cudd_bddIthVar(dd,vOrder->pArray[iVar10]);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
      lVar8 = lVar8 + 1;
      pVVar5 = pAig->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        iVar10 = *(int *)((long)pvVar1 + 0x24);
        if (((long)iVar10 < 0) || (vOrder->nSize <= iVar10)) goto LAB_007e5d34;
        if (-1 < vOrder->pArray[iVar10]) {
          pDVar3 = Cudd_bddIthVar(dd,vOrder->pArray[iVar10]);
          *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
          Cudd_Ref(pDVar3);
          pVVar5 = pAig->vObjs;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  iVar10 = pAig->nRegs;
  if (0 < iVar10) {
    iVar6 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar6;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_007e5d53;
      pvVar1 = pAig->vCos->pArray[uVar2];
      iVar10 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar10 < 0) || (vOrder->nSize <= iVar10)) {
LAB_007e5d34:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar3 = Cudd_bddIthVar(dd,vOrder->pArray[iVar10]);
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
      iVar6 = iVar6 + 1;
      iVar10 = pAig->nRegs;
    } while (iVar6 < iVar10);
    pVVar5 = pAig->vObjs;
  }
  __ptr = (Vec_Ptr_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  __ptr->pArray = ppvVar4;
  if (pVVar5->nSize < 1) {
    iVar6 = 0;
    local_38 = 100;
  }
  else {
    uVar7 = 0;
    local_38 = 100;
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) +
                                          0x28)),
                             (DdNode *)
                             ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                             *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) +
                                       0x28)));
        if (pDVar3 == (DdNode *)0x0) goto LAB_007e5c93;
        Cudd_Ref(pDVar3);
        if (*(DdNode **)((long)pvVar1 + 0x28) == (DdNode *)0x0) {
          *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
        }
        else {
          n = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar1 + 0x28),pDVar3);
          if (n == (DdNode *)0x0) goto LAB_007e5c93;
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,pDVar3);
          iVar6 = (int)uVar7;
          iVar10 = (int)local_38;
          if (iVar6 == iVar10) {
            if (iVar10 < 0x10) {
              if (__ptr->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(__ptr->pArray,0x80);
              }
              __ptr->pArray = ppvVar4;
              __ptr->nCap = 0x10;
              local_38 = 0x10;
            }
            else {
              local_38 = (ulong)(uint)(iVar10 * 2);
              if (__ptr->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(local_38 * 8);
              }
              else {
                ppvVar4 = (void **)realloc(__ptr->pArray,local_38 * 8);
              }
              __ptr->pArray = ppvVar4;
              __ptr->nCap = iVar10 * 2;
            }
          }
          else {
            ppvVar4 = __ptr->pArray;
          }
          __ptr->nSize = iVar6 + 1U;
          ppvVar4[iVar6] = n;
          uVar7 = (ulong)(iVar6 + 1U);
        }
      }
      iVar6 = (int)uVar7;
      lVar8 = lVar8 + 1;
      pVVar5 = pAig->vObjs;
    } while (lVar8 < pVVar5->nSize);
    iVar10 = pAig->nRegs;
  }
  if (0 < iVar10) {
    iVar10 = 0;
    uVar7 = (long)iVar6;
    do {
      uVar2 = pAig->nTruePos + iVar10;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_007e5d53:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      uVar9 = *(ulong *)((long)pvVar1 + 8);
      pDVar3 = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar1 + 0x28),
                            (DdNode *)
                            ((ulong)((uint)uVar9 & 1) ^
                            *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x28)));
      if (pDVar3 == (DdNode *)0x0) goto LAB_007e5c93;
      Cudd_Ref(pDVar3);
      iVar6 = (int)local_38;
      if ((int)uVar7 == iVar6) {
        if (iVar6 < 0x10) {
          if (__ptr->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(__ptr->pArray,0x80);
          }
          __ptr->pArray = ppvVar4;
          __ptr->nCap = 0x10;
          local_38 = 0x10;
        }
        else {
          local_38 = (ulong)(uint)(iVar6 * 2);
          if (__ptr->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(local_38 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(__ptr->pArray,local_38 * 8);
          }
          __ptr->pArray = ppvVar4;
          __ptr->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar4 = __ptr->pArray;
      }
      __ptr->nSize = (int)(uVar7 + 1);
      ppvVar4[uVar7] = pDVar3;
      iVar10 = iVar10 + 1;
      uVar7 = uVar7 + 1;
    } while (iVar10 < pAig->nRegs);
    pVVar5 = pAig->vObjs;
  }
  if (pVVar5->nSize < 1) {
    return __ptr;
  }
  lVar8 = 0;
  do {
    pvVar1 = pVVar5->pArray[lVar8];
    if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x28));
      pVVar5 = pAig->vObjs;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 < pVVar5->nSize);
  return __ptr;
LAB_007e5c93:
  pVVar5 = pAig->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if (((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) &&
         (*(DdNode **)((long)pvVar1 + 0x28) != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x28));
        pVVar5 = pAig->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  ppvVar4 = __ptr->pArray;
  if ((int)uVar7 < 1) {
    if (ppvVar4 == (void **)0x0) goto LAB_007e5d18;
  }
  else {
    uVar9 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)ppvVar4[uVar9]);
      uVar9 = uVar9 + 1;
    } while ((uVar7 & 0xffffffff) != uVar9);
  }
  free(ppvVar4);
LAB_007e5d18:
  free(__ptr);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4DerivePartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
        {
            pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
            Cudd_Ref( (DdNode *)pObj->pData );
        }
    Saig_ManForEachLi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute intermediate BDDs
    vRoots = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
            goto finish;
        Cudd_Ref( bBdd );
        if ( pObj->pData == NULL )
        {
            pObj->pData = bBdd;
            continue;
        }
        // create new partition
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
    // compute register output BDDs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd0 );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
//printf( "\n" );
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
    // early termination
finish:
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrForEachEntry( DdNode *, vRoots, bPart, i )
        Cudd_RecursiveDeref( dd, bPart );
    Vec_PtrFree( vRoots );
    return NULL;
}